

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::CanIWriteThisFile(cmMakefile *this,char *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  allocator local_b4;
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"CMAKE_DISABLE_SOURCE_CHANGES","");
  pcVar4 = GetDefinition(this,&local_b0);
  bVar2 = cmSystemTools::IsOn(pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  bVar3 = true;
  if (bVar2) {
    pcVar4 = cmake::GetHomeDirectory(this->GlobalGenerator->CMakeInstance);
    std::__cxx11::string::string((string *)&local_b0,pcVar4,(allocator *)&local_50);
    pcVar4 = cmake::GetHomeOutputDirectory(this->GlobalGenerator->CMakeInstance);
    std::__cxx11::string::string((string *)&local_90,pcVar4,(allocator *)&local_70);
    bVar2 = cmsys::SystemTools::SameFile(&local_b0,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"CMAKE_DISABLE_IN_SOURCE_BUILD","");
      pcVar4 = GetDefinition(this,&local_b0);
      bVar3 = cmSystemTools::IsOn(pcVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      bVar3 = !bVar3;
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,fileName,&local_b1);
      pcVar4 = cmake::GetHomeDirectory(this->GlobalGenerator->CMakeInstance);
      std::__cxx11::string::string((string *)&local_90,pcVar4,&local_b2);
      bVar2 = cmsys::SystemTools::IsSubDirectory(&local_b0,&local_90);
      bVar3 = true;
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_50,fileName,&local_b3);
        pcVar4 = cmake::GetHomeOutputDirectory(this->GlobalGenerator->CMakeInstance);
        std::__cxx11::string::string((string *)&local_70,pcVar4,&local_b4);
        bVar3 = cmsys::SystemTools::IsSubDirectory(&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return bVar3;
}

Assistant:

bool cmMakefile::CanIWriteThisFile(const char* fileName) const
{
  if (!this->IsOn("CMAKE_DISABLE_SOURCE_CHANGES")) {
    return true;
  }
  // If we are doing an in-source build, then the test will always fail
  if (cmSystemTools::SameFile(this->GetHomeDirectory(),
                              this->GetHomeOutputDirectory())) {
    return !this->IsOn("CMAKE_DISABLE_IN_SOURCE_BUILD");
  }

  return !cmSystemTools::IsSubDirectory(fileName, this->GetHomeDirectory()) ||
    cmSystemTools::IsSubDirectory(fileName, this->GetHomeOutputDirectory());
}